

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datefmt.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::DateFormat::format
          (DateFormat *this,UDate date,UnicodeString *appendTo,FieldPositionIterator *posIter,
          UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  undefined4 extraout_var;
  Calendar *calClone;
  UErrorCode *status_local;
  FieldPositionIterator *posIter_local;
  UnicodeString *appendTo_local;
  UDate date_local;
  DateFormat *this_local;
  Calendar *this_00;
  
  if (this->fCalendar != (Calendar *)0x0) {
    iVar2 = (*(this->fCalendar->super_UObject)._vptr_UObject[3])();
    this_00 = (Calendar *)CONCAT44(extraout_var,iVar2);
    if (this_00 != (Calendar *)0x0) {
      Calendar::setTime(this_00,date,status);
      UVar1 = ::U_SUCCESS(*status);
      if (UVar1 != '\0') {
        (*(this->super_Format).super_UObject._vptr_UObject[9])(this,this_00,appendTo,posIter,status)
        ;
      }
      if (this_00 != (Calendar *)0x0) {
        (*(this_00->super_UObject)._vptr_UObject[1])();
      }
    }
  }
  return appendTo;
}

Assistant:

UnicodeString&
DateFormat::format(UDate date, UnicodeString& appendTo, FieldPositionIterator* posIter,
                   UErrorCode& status) const {
    if (fCalendar != NULL) {
        Calendar* calClone = fCalendar->clone();
        if (calClone != NULL) {
            calClone->setTime(date, status);
            if (U_SUCCESS(status)) {
               format(*calClone, appendTo, posIter, status);
            }
            delete calClone;
        }
    }
    return appendTo;
}